

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfusionstyle.cpp
# Opt level: O2

QFusionStyle * __thiscall
QFusionStyle::standardPixmap
          (QFusionStyle *this,StandardPixmap standardPixmap,QStyleOption *opt,QWidget *widget)

{
  long lVar1;
  long in_R8;
  long in_FS_OFFSET;
  double dVar2;
  QArrayDataPointer<QSize> local_58;
  QIcon icon;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  icon.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  iconFromTheme((QFusionStyle *)&icon,standardPixmap);
  QIcon::availableSizes((Mode)&local_58,(State)(QFusionStyle *)&icon);
  QArrayDataPointer<QSize>::~QArrayDataPointer(&local_58);
  if (local_58.size == 0) {
    QCommonStyle::standardPixmap
              (&this->super_QCommonStyle,standardPixmap,(QStyleOption *)((ulong)opt & 0xffffffff),
               widget);
  }
  else {
    local_58.d = (Data *)0x1000000010;
    if (in_R8 == 0) {
      dVar2 = (double)QGuiApplication::devicePixelRatio();
    }
    else {
      dVar2 = (double)QPaintDevice::devicePixelRatio();
    }
    QIcon::pixmap((QSize *)this,dVar2,(Mode)&icon,(State)&local_58);
  }
  QIcon::~QIcon(&icon);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QPixmap QFusionStyle::standardPixmap(StandardPixmap standardPixmap, const QStyleOption *opt,
                                     const QWidget *widget) const
{
    const auto icon = iconFromTheme(standardPixmap);
    if (!icon.availableSizes().isEmpty())
        return icon.pixmap(QSize(16, 16), QStyleHelper::getDpr(widget));
    return QCommonStyle::standardPixmap(standardPixmap, opt, widget);
}